

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Integrator.cpp
# Opt level: O0

void __thiscall iDynTree::optimalcontrol::integrators::Integrator::Integrator(Integrator *this)

{
  IntegratorInfoData *in_RDI;
  IntegratorInfoData *in_stack_ffffffffffffff98;
  shared_ptr<iDynTree::optimalcontrol::DynamicalSystem> *in_stack_ffffffffffffffa0;
  IntegratorInfo *this_00;
  
  *(undefined ***)&in_RDI->name = &PTR__Integrator_003fa840;
  (in_RDI->name)._M_string_length = 0;
  std::shared_ptr<iDynTree::optimalcontrol::DynamicalSystem>::shared_ptr
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  std::
  vector<iDynTree::optimalcontrol::integrators::SolutionElement,_std::allocator<iDynTree::optimalcontrol::integrators::SolutionElement>_>
  ::vector((vector<iDynTree::optimalcontrol::integrators::SolutionElement,_std::allocator<iDynTree::optimalcontrol::integrators::SolutionElement>_>
            *)0x2f4f4e);
  operator_new(0x30);
  IntegratorInfoData::IntegratorInfoData(in_RDI);
  std::shared_ptr<iDynTree::optimalcontrol::integrators::IntegratorInfoData>::
  shared_ptr<iDynTree::optimalcontrol::integrators::IntegratorInfoData,void>
            ((shared_ptr<iDynTree::optimalcontrol::integrators::IntegratorInfoData> *)
             in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  this_00 = (IntegratorInfo *)((long)&in_RDI[1].name.field_2 + 8);
  std::shared_ptr<iDynTree::optimalcontrol::integrators::IntegratorInfoData>::shared_ptr
            ((shared_ptr<iDynTree::optimalcontrol::integrators::IntegratorInfoData> *)this_00,
             (shared_ptr<iDynTree::optimalcontrol::integrators::IntegratorInfoData> *)
             in_stack_ffffffffffffff98);
  IntegratorInfo::IntegratorInfo
            (this_00,(shared_ptr<iDynTree::optimalcontrol::integrators::IntegratorInfoData> *)
                     in_stack_ffffffffffffff98);
  std::shared_ptr<iDynTree::optimalcontrol::integrators::IntegratorInfoData>::~shared_ptr
            ((shared_ptr<iDynTree::optimalcontrol::integrators::IntegratorInfoData> *)0x2f4fc9);
  return;
}

Assistant:

Integrator::Integrator()
            : m_dTmax(0)
            , m_dynamicalSystem_ptr(nullptr)
            , m_infoData(new IntegratorInfoData)
            , m_info(m_infoData)
            {
            }